

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::average_down_faces(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  DistributionMapping *this;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FabArray<amrex::FArrayBox> *pFVar5;
  FabArray<amrex::FArrayBox> *pFVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  Periodicity *period;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  ulong local_328;
  int local_31c;
  long local_300;
  int kk;
  undefined1 local_2d8 [24];
  pointer pbStack_2c0;
  undefined8 local_2b8;
  int local_2b0;
  long local_290;
  int jj;
  undefined8 local_280;
  int local_278;
  uint local_274;
  uint local_270;
  int local_26c;
  FabArray<amrex::FArrayBox> *local_260;
  FabArray<amrex::FArrayBox> *local_258;
  IntVect *local_250;
  ulong local_248;
  long local_240;
  ulong local_238;
  long local_230;
  long local_228;
  long local_220;
  BoxArray local_218;
  MFIter mfi;
  
  uVar8 = 0;
  switch((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar8 = *(uint *)&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                      m_op;
    break;
  default:
    uVar8 = *(uint *)((long)&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                             m_bat.m_op + 4);
  }
  uVar10 = 0;
  do {
    if ((uVar8 >> (uVar10 & 0x1f) & 1) != 0) goto LAB_004b0aa4;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 3);
  uVar10 = 3;
LAB_004b0aa4:
  if ((2 < uVar10) || ((uVar8 & ~(1 << (uVar10 & 0x1f))) != 0)) {
    Abort_host("average_down_faces: not face index type");
  }
  uVar8 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  this = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  bVar7 = DistributionMapping::operator==
                    (this,&(crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           distributionMap);
  if ((bVar7) &&
     ((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
    local_250 = ratio;
    MFIter::MFIter(&mfi,(FabArrayBase *)crse,true);
    pFVar5 = &fine->super_FabArray<amrex::FArrayBox>;
    pFVar6 = &crse->super_FabArray<amrex::FArrayBox>;
    if (mfi.currentIndex < mfi.endIndex) {
      do {
        local_258 = pFVar6;
        local_260 = pFVar5;
        pFVar6 = local_258;
        pFVar5 = local_260;
        MFIter::growntilebox((Box *)&local_280,&mfi,ngcrse);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_218,pFVar6,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_2d8,pFVar5,&mfi);
        if (0 < (int)uVar8) {
          local_238 = (ulong)local_274;
          local_248 = (ulong)local_270;
          local_290 = (long)local_280._4_4_;
          local_328 = 0;
          do {
            iVar4 = local_278;
            if (local_278 <= local_26c) {
              do {
                if (local_280._4_4_ <= (int)local_270) {
                  uVar1 = local_250->vect[0];
                  uVar2 = local_250->vect[1];
                  uVar3 = local_250->vect[2];
                  iVar9 = uVar3 * iVar4;
                  local_230 = (long)(int)uVar1;
                  local_240 = (long)(int)uVar2;
                  local_31c = uVar2 * local_280._4_4_;
                  local_300 = local_290;
                  do {
                    if ((int)local_280 <= (int)local_274) {
                      _jj = local_300 * local_240;
                      local_220 = (local_300 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                                  CONCAT44(local_218.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                                           local_218.m_bat.m_op.m_bndryReg.m_typ.itype) * 8 +
                                  CONCAT44(local_218.m_bat.m_op.m_indexType.m_typ.itype,
                                           local_218.m_bat.m_bat_type) +
                                  ((long)iVar4 -
                                  (long)local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                                  local_218.m_bat.m_op._12_8_ * 8 +
                                  local_218.m_bat.m_op._20_8_ * local_328 * 8;
                      local_228 = (long)local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2];
                      lVar13 = (long)(int)local_280;
                      iVar14 = uVar1 * (int)local_280;
                      do {
                        if (uVar10 == 2) {
                          if ((int)uVar2 < 1) {
                            dVar16 = 0.0;
                          }
                          else {
                            dVar16 = 0.0;
                            uVar12 = 0;
                            do {
                              if (0 < (int)uVar1) {
                                uVar15 = (ulong)uVar1;
                                iVar11 = iVar14 - (int)local_2b8;
                                do {
                                  dVar16 = dVar16 + *(double *)
                                                     (local_2d8._0_8_ +
                                                     (((long)iVar9 - (long)local_2b0) *
                                                      local_2d8._16_8_ +
                                                     (long)pbStack_2c0 * local_328 +
                                                     (long)(((int)_jj + (int)uVar12) -
                                                           local_2b8._4_4_) * local_2d8._8_8_ +
                                                     (long)iVar11) * 8);
                                  iVar11 = iVar11 + 1;
                                  uVar15 = uVar15 - 1;
                                } while (uVar15 != 0);
                              }
                              uVar12 = uVar12 + 1;
                            } while (uVar12 != uVar2);
                          }
                          dVar16 = dVar16 * (1.0 / (double)(int)(uVar2 * uVar1));
LAB_004b0f4b:
                          *(double *)(local_220 + (lVar13 - local_228) * 8) = dVar16;
                        }
                        else {
                          if (uVar10 == 1) {
                            if ((int)uVar3 < 1) {
                              dVar16 = 0.0;
                            }
                            else {
                              dVar16 = 0.0;
                              uVar12 = 0;
                              do {
                                if (0 < (int)uVar1) {
                                  uVar15 = (ulong)uVar1;
                                  iVar11 = iVar14 - (int)local_2b8;
                                  do {
                                    dVar16 = dVar16 + *(double *)
                                                       (local_2d8._0_8_ +
                                                       ((_jj - local_2b8._4_4_) * local_2d8._8_8_ +
                                                       (long)pbStack_2c0 * local_328 +
                                                       (long)((iVar9 + (int)uVar12) - local_2b0) *
                                                       local_2d8._16_8_ + (long)iVar11) * 8);
                                    iVar11 = iVar11 + 1;
                                    uVar15 = uVar15 - 1;
                                  } while (uVar15 != 0);
                                }
                                uVar12 = uVar12 + 1;
                              } while (uVar12 != uVar3);
                            }
                            dVar16 = dVar16 * (1.0 / (double)(int)(uVar3 * uVar1));
                            goto LAB_004b0f4b;
                          }
                          if (uVar10 == 0) {
                            if ((int)uVar3 < 1) {
                              dVar16 = 0.0;
                            }
                            else {
                              dVar16 = 0.0;
                              uVar12 = 0;
                              do {
                                if (0 < (int)uVar2) {
                                  uVar15 = (ulong)uVar2;
                                  iVar11 = local_31c - local_2b8._4_4_;
                                  do {
                                    dVar16 = dVar16 + *(double *)
                                                       (local_2d8._0_8_ +
                                                       ((lVar13 * local_230 - (long)(int)local_2b8)
                                                       + (long)pbStack_2c0 * local_328 +
                                                         (long)((iVar9 + (int)uVar12) - local_2b0) *
                                                         local_2d8._16_8_ +
                                                         local_2d8._8_8_ * (long)iVar11) * 8);
                                    iVar11 = iVar11 + 1;
                                    uVar15 = uVar15 - 1;
                                  } while (uVar15 != 0);
                                }
                                uVar12 = uVar12 + 1;
                              } while (uVar12 != uVar3);
                            }
                            dVar16 = dVar16 * (1.0 / (double)(int)(uVar3 * uVar2));
                            goto LAB_004b0f4b;
                          }
                        }
                        lVar13 = lVar13 + 1;
                        iVar14 = iVar14 + uVar1;
                      } while (local_274 + 1 != (int)lVar13);
                    }
                    local_300 = local_300 + 1;
                    local_31c = local_31c + uVar2;
                  } while (local_270 + 1 != (int)local_300);
                }
                bVar7 = iVar4 != local_26c;
                iVar4 = iVar4 + 1;
              } while (bVar7);
            }
            local_328 = local_328 + 1;
          } while (local_328 != uVar8);
        }
        MFIter::operator++(&mfi);
        pFVar5 = local_260;
        pFVar6 = local_258;
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    coarsen(&local_218,&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,ratio);
    local_2d8._0_8_ = (double *)0x1;
    local_2d8._8_8_ = (Arena *)0x0;
    local_2d8._16_8_ = (pointer)0x0;
    pbStack_2c0 = (pointer)0x0;
    local_2b8 = (pointer)0x0;
    local_280 = &PTR__FabFactory_0074e8d0;
    MultiFab::MultiFab((MultiFab *)&mfi,&local_218,this,uVar8,ngcrse,(MFInfo *)local_2d8,
                       (FabFactory<amrex::FArrayBox> *)&local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2d8 + 0x10));
    BoxArray::~BoxArray(&local_218);
    average_down_faces(fine,(MultiFab *)&mfi,ratio,ngcrse);
    period = Periodicity::NonPeriodic();
    local_2d8._4_4_ = ngcrse;
    local_2d8._0_4_ = ngcrse;
    local_2d8._8_4_ = ngcrse;
    local_218.m_bat.m_bat_type = ngcrse;
    local_218.m_bat.m_op.m_indexType.m_typ.itype = (BATindexType)ngcrse;
    local_218.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)ngcrse;
    FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)&mfi,0,0,uVar8,
               (IntVect *)&local_218,(IntVect *)local_2d8,period,COPY,(CPC *)0x0,false);
    MultiFab::~MultiFab((MultiFab *)&mfi);
  }
  return;
}

Assistant:

void average_down_faces (const MultiFab& fine, MultiFab& crse,
                             const IntVect& ratio, int ngcrse)
    {
        AMREX_ASSERT(crse.nComp() == fine.nComp());
        AMREX_ASSERT(fine.ixType() == crse.ixType());
        const auto type = fine.ixType();
        int dir;
        for (dir = 0; dir < AMREX_SPACEDIM; ++dir) {
            if (type.nodeCentered(dir)) break;
        }
        auto tmptype = type;
        tmptype.unset(dir);
        if (dir >= AMREX_SPACEDIM || !tmptype.cellCentered()) {
            amrex::Abort("average_down_faces: not face index type");
        }
        const int ncomp = crse.nComp();
        if (isMFIterSafe(fine, crse))
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse.isFusingCandidate()) {
                auto const& crsema = crse.arrays();
                auto const& finema = fine.const_arrays();
                ParallelFor(crse, IntVect(ngcrse), ncomp,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    amrex_avgdown_faces(i,j,k,n, crsema[box_no], finema[box_no], 0, 0, ratio, dir);
                });
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ngcrse);
                    Array4<Real> const& crsearr = crse.array(mfi);
                    Array4<Real const> const& finearr = fine.const_array(mfi);

                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                    {
                        amrex_avgdown_faces(i,j,k,n, crsearr, finearr, 0, 0, ratio, dir);
                    });
                }
            }
        }
        else
        {
            MultiFab ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                          ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            average_down_faces(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
        }
    }